

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O0

string * __thiscall MinVR::VRDataQueue::printQueue_abi_cxx11_(VRDataQueue *this)

{
  bool bVar1;
  undefined1 uVar2;
  pointer ppVar3;
  string *in_RDI;
  string identifier;
  const_iterator it;
  int i;
  char buf [6];
  string *out;
  map<std::pair<long_long,_int>,_MinVR::VRDataQueueItem,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
  *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined1 local_109 [33];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [32];
  _Self local_30;
  _Self local_28;
  int local_1c;
  char local_17 [6];
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  local_1c = 0;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::pair<long_long,_int>,_MinVR::VRDataQueueItem,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
       ::begin(in_stack_fffffffffffffe98);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::pair<long_long,_int>,_MinVR::VRDataQueueItem,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
         ::end(in_stack_fffffffffffffe98);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    local_1c = local_1c + 1;
    sprintf(local_17,"%d");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (allocator<char> *)in_stack_fffffffffffffed0);
    std::allocator<char>::~allocator(&local_51);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>
                           *)in_stack_fffffffffffffea0);
    uVar2 = VRDataQueueItem::isSerialized(&ppVar3->second);
    if ((bool)uVar2) {
      std::__cxx11::string::operator+=(local_50,"*");
    }
    else {
      std::__cxx11::string::operator+=(local_50," ");
    }
    in_stack_fffffffffffffea0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (allocator<char> *)in_stack_fffffffffffffed0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffea8),(char *)in_stack_fffffffffffffea0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>::
    operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>
                *)in_stack_fffffffffffffea0);
    VRDataQueueItem::serialize_abi_cxx11_
              ((VRDataQueueItem *)CONCAT17(uVar2,in_stack_fffffffffffffea8));
    std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffea8),(char *)in_stack_fffffffffffffea0);
    std::__cxx11::string::operator+=((string *)in_RDI,local_88);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string((string *)(local_109 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_109);
    std::__cxx11::string::~string(local_50);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>::
    operator++((_Rb_tree_const_iterator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>
                *)in_stack_fffffffffffffea0);
  }
  return in_RDI;
}

Assistant:

std::string VRDataQueue::printQueue() const {

  std::string out;

  char buf[6];  // No queues more than a million entries long.
  int i = 0;
  for (VRDataList::const_iterator it = _dataMap.begin();
       it != _dataMap.end(); ++it) {
    sprintf(buf, "%d", ++i);
    std::string identifier = "element";
    if (it->second.isSerialized()) {
      identifier += "*";
    } else {
      identifier += " ";
    }
    out += identifier + std::string(buf) + ": " + it->second.serialize() + "\n";
  }

  return out;
}